

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

void __thiscall
helics::FilterFederate::acceptDestProcessReturn
          (FilterFederate *this,GlobalFederateId fid,uint32_t pid)

{
  bool bVar1;
  ActionMessage *in_RDI;
  ActionMessage unblock;
  BaseType fid_index;
  key_type *in_stack_ffffffffffffff08;
  ActionMessage *__args;
  action_t in_stack_ffffffffffffff2c;
  GlobalFederateId in_stack_ffffffffffffff30;
  InterfaceHandle in_stack_ffffffffffffff34;
  Time in_stack_ffffffffffffff48;
  Time in_stack_ffffffffffffff50;
  int32_t in_stack_ffffffffffffff6c;
  FilterFederate *in_stack_ffffffffffffff70;
  GlobalFederateId local_4;
  
  GlobalFederateId::baseValue(&local_4);
  std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::operator[]((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                *)in_stack_ffffffffffffff50.internalTimeCode,
               (key_type *)in_stack_ffffffffffffff48.internalTimeCode);
  std::set<int,_std::less<int>,_std::allocator<int>_>::erase
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_RDI,in_stack_ffffffffffffff08);
  std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::operator[]((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                *)in_stack_ffffffffffffff50.internalTimeCode,
               (key_type *)in_stack_ffffffffffffff48.internalTimeCode);
  bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x57a3e6);
  if (bVar1) {
    __args = (ActionMessage *)&stack0xffffffffffffff28;
    ActionMessage::ActionMessage
              ((ActionMessage *)
               CONCAT44(in_stack_ffffffffffffff34.hid,in_stack_ffffffffffffff30.gid),
               in_stack_ffffffffffffff2c);
    std::function<void_(const_helics::ActionMessage_&)>::operator()
              ((function<void_(const_helics::ActionMessage_&)> *)in_RDI,__args);
    ActionMessage::~ActionMessage(in_RDI);
  }
  clearTimeReturn(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  return;
}

Assistant:

void FilterFederate::acceptDestProcessReturn(GlobalFederateId fid, uint32_t pid)
{
    // nothing further to process
    auto fid_index = fid.baseValue();
    ongoingDestFilterProcesses[fid_index].erase(pid);
    if (ongoingDestFilterProcesses[fid_index].empty()) {
        ActionMessage unblock(CMD_TIME_UNBLOCK);
        unblock.dest_id = fid;
        unblock.source_id = mFedID;
        unblock.sequenceID = pid;
        mSendMessage(unblock);
    }
    clearTimeReturn(pid);
}